

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O2

void __thiscall helics::BaseTimeCoordinator::disconnect(BaseTimeCoordinator *this)

{
  int iVar1;
  pointer pDVar2;
  bool bVar3;
  DependencyInfo *dep;
  pointer pDVar4;
  bool bVar5;
  ActionMessage bye;
  ActionMessage multi;
  
  if (this->disconnected == false) {
    if ((this->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this->disconnected = true;
    }
    else {
      ActionMessage::ActionMessage(&bye,cmd_disconnect);
      bye.source_id.gid = (this->mSourceId).gid;
      pDVar4 = (this->dependencies).dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(this->dependencies).dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 == 0x58) {
        if (((pDVar4->dependency == true) &&
            ((pDVar4->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
           (pDVar4->dependent == true)) {
          bye.dest_id.gid = (pDVar4->fedID).gid;
          if (bye.dest_id.gid == bye.source_id.gid) {
            (*this->_vptr_BaseTimeCoordinator[3])(this,&bye);
          }
          else {
            std::function<void_(const_helics::ActionMessage_&)>::operator()
                      (&this->sendMessageFunction,&bye);
          }
        }
      }
      else {
        ActionMessage::ActionMessage(&multi,cmd_multi_message);
        pDVar2 = (this->dependencies).dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = false;
        for (pDVar4 = (this->dependencies).dependencies.
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start; pDVar4 != pDVar2;
            pDVar4 = pDVar4 + 1) {
          if (((pDVar4->dependency == true) &&
              ((pDVar4->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
             (bVar3 = bVar5, pDVar4->dependent == true)) {
            iVar1 = (pDVar4->fedID).gid;
            bVar3 = true;
            if (iVar1 != (this->mSourceId).gid) {
              bye.dest_id.gid = iVar1;
              appendMessage(&multi,&bye);
              bVar3 = bVar5;
            }
          }
          bVar5 = bVar3;
        }
        if (bVar5) {
          bye.dest_id.gid = (this->mSourceId).gid;
          (*this->_vptr_BaseTimeCoordinator[3])(this);
        }
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  (&this->sendMessageFunction,&multi);
        ActionMessage::~ActionMessage(&multi);
      }
      this->disconnected = true;
      ActionMessage::~ActionMessage(&bye);
    }
  }
  return;
}

Assistant:

void BaseTimeCoordinator::disconnect()
{
    if (disconnected) {
        return;
    }

    if (dependencies.empty()) {
        disconnected = true;
        return;
    }
    ActionMessage bye(CMD_DISCONNECT);
    bye.source_id = mSourceId;
    if (dependencies.size() == 1) {
        auto& dep = *dependencies.begin();
        if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
            bye.dest_id = dep.fedID;
            if (bye.dest_id == mSourceId) {
                processTimeMessage(bye);
            } else {
                sendMessageFunction(bye);
            }
        }

    } else {
        ActionMessage multi(CMD_MULTI_MESSAGE);
        bool hasLocal{false};
        for (const auto& dep : dependencies) {
            if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                if (dep.fedID == mSourceId) {
                    hasLocal = true;
                } else {
                    bye.dest_id = dep.fedID;
                    appendMessage(multi, bye);
                }
            }
        }
        if (hasLocal) {
            bye.dest_id = mSourceId;
            processTimeMessage(bye);
        }
        sendMessageFunction(multi);
    }
    disconnected = true;
}